

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O2

void __thiscall Timer::Timer(Timer *this)

{
  (this->tm_queue).c.super__Vector_base<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tm_queue).c.super__Vector_base<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tm_queue).c.super__Vector_base<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tm_running)._M_base._M_i = false;
  (this->tm_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->tm_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->tm_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->tm_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  (this->tm_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  std::condition_variable::condition_variable(&this->tm_cond);
  (this->tm_tick_thread)._M_id._M_thread = 0;
  Threadpool::Threadpool(&this->tm_thread_pool,2);
  (this->tm_id).super___atomic_base<int>._M_i = 0;
  (this->tm_id_state_map).hm_map._M_h._M_buckets =
       &(this->tm_id_state_map).hm_map._M_h._M_single_bucket;
  (this->tm_id_state_map).hm_map._M_h._M_bucket_count = 1;
  (this->tm_id_state_map).hm_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tm_id_state_map).hm_map._M_h._M_element_count = 0;
  (this->tm_id_state_map).hm_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tm_id_state_map).hm_map._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tm_id_state_map).hm_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->tm_id_state_map).hm_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->tm_id_state_map).hm_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->tm_id_state_map).hm_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->tm_id_state_map).hm_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->tm_id_state_map).hm_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  LOCK();
  (this->tm_id).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->tm_running)._M_base._M_i = true;
  UNLOCK();
  return;
}

Assistant:

Timer() : tm_thread_pool(DEFAULT_TIMER_THREAD_POOL_SIZE) {
// cout <<"create timer" <<endl;
        tm_id.store(0);
        tm_running.store(true);
    }